

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<1,_0,_13,_0,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  MatrixCaseUtils local_bc [12];
  VecAccess<float,_4,_3> local_b0;
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_58;
  
  tcu::Matrix<float,_4,_4>::Matrix(&local_98,(Matrix<float,_4,_4> *)s_constInMat4);
  tcu::operator-(&local_58,&local_98,-0.2);
  reduceToVec3(local_bc,&local_58);
  local_b0.m_vector = &evalCtx->color;
  local_b0.m_index[0] = 0;
  local_b0.m_index[1] = 1;
  local_b0.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_b0,(Vector<float,_3> *)local_bc);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) - getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}